

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

child_iterator * __thiscall
Archive::child_begin(child_iterator *__return_storage_ptr__,Archive *this,bool SkipInternal)

{
  size_type sVar1;
  char *pcVar2;
  child_iterator *it;
  Child local_50;
  uint8_t *local_38;
  uint8_t *loc;
  uint8_t *local_28;
  uint32_t local_20;
  uint16_t local_1c;
  byte local_11;
  Archive *pAStack_10;
  bool SkipInternal_local;
  Archive *this_local;
  
  local_11 = SkipInternal;
  pAStack_10 = this;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(this->data);
  if (sVar1 == 0) {
    child_end(__return_storage_ptr__,this);
  }
  else if ((local_11 & 1) == 0) {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data(this->data);
    local_38 = (uint8_t *)(pcVar2 + 8);
    child_iterator::child_iterator(__return_storage_ptr__);
    Child::Child(&local_50,this,local_38,&__return_storage_ptr__->error);
    (__return_storage_ptr__->child).parent = local_50.parent;
    (__return_storage_ptr__->child).data = local_50.data;
    (__return_storage_ptr__->child).len = local_50.len;
    (__return_storage_ptr__->child).startOfFile = local_50.startOfFile;
  }
  else {
    child_iterator::child_iterator(__return_storage_ptr__);
    Child::Child((Child *)&loc,this,this->firstRegularData,&__return_storage_ptr__->error);
    (__return_storage_ptr__->child).parent = (Archive *)loc;
    (__return_storage_ptr__->child).data = local_28;
    (__return_storage_ptr__->child).len = local_20;
    (__return_storage_ptr__->child).startOfFile = local_1c;
  }
  return __return_storage_ptr__;
}

Assistant:

Archive::child_iterator Archive::child_begin(bool SkipInternal) const {
  if (data.size() == 0) {
    return child_end();
  }

  if (SkipInternal) {
    child_iterator it;
    it.child = Child(this, firstRegularData, &it.error);
    return it;
  }

  auto* loc = (const uint8_t*)data.data() + strlen(magic);
  child_iterator it;
  it.child = Child(this, loc, &it.error);
  return it;
}